

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalidModelUnsupportedLayersForBP(void)

{
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *pNVar6;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar7;
  UnaryFunctionLayerParams *pUVar8;
  PoolingLayerParams *this_02;
  NetworkUpdateParameters *pNVar9;
  LossLayer *this_03;
  CategoricalCrossEntropyLossLayer *this_04;
  ostream *poVar10;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  m.isupdatable_ = true;
  m.specificationversion_ = 4;
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  this = &this_00->layers_;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar6,"inner_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"ip");
  pNVar6->isupdatable_ = true;
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar6);
  this_01->inputchannels_ = 1;
  this_01->outputchannels_ = 1;
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
  pWVar7->isupdatable_ = true;
  this_01->hasbias_ = true;
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_01);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_01);
  pWVar7->isupdatable_ = true;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar6,"abs_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"ip");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"abs_out");
  pUVar8 = CoreML::Specification::NeuralNetworkLayer::mutable_unary(pNVar6);
  pUVar8->type_ = 6;
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar6,"pooling_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"abs_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"B");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_pooling(pNVar6);
  this_02->type_ = 1;
  this_02->globalpooling_ = true;
  CoreML::Specification::PoolingLayerParams::mutable_valid(this_02);
  pNVar9 = CoreML::Specification::NeuralNetwork::mutable_updateparams(this_00);
  this_03 = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                      (&pNVar9->losslayers_);
  CoreML::Specification::LossLayer::set_name(this_03,"loss_layer");
  this_04 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(this_03);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(this_04,"B");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_04,"label_target");
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x168);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,"!((res).good())");
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar1;
}

Assistant:

int testInvalidModelUnsupportedLayersForBP() {

    /* checks if there are layers between updatable-marked layers and loss function that do not support back-propagation
     input ---> inner_product (U) ----> ABS (not supported for BP) ---> pooling --> output
     */


    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("ip");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    auto *l2 = nn->add_layers();
    l2->set_name("abs_layer");
    l2->add_input("ip");
    l2->add_output("abs_out");
    auto *elem = l2->mutable_unary();
    elem->set_type(Specification::UnaryFunctionLayerParams::ABS);

    auto *l3 = nn->add_layers();
    l3->set_name("pooling_layer");
    l3->add_input("abs_out");
    l3->add_output("B");
    auto *params = l3->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("loss_layer");

    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("B");
    ceLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}